

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O1

void Map_LibraryPrintTree(Map_SuperLib_t *pLib)

{
  float fVar1;
  float fVar2;
  Map_Super_t *pMVar3;
  char *pcVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  float *pfVar9;
  
  lVar5 = (long)pLib->nVarsMax;
  if (lVar5 < 0x14) {
    do {
      pMVar3 = pLib->ppSupers[lVar5];
      printf("%6d  ",(ulong)(uint)pMVar3->Num);
      uVar6 = 0x2a;
      if ((pMVar3->field_0x4 & 1) == 0) {
        uVar6 = 0x20;
      }
      printf("%c ",uVar6);
      pcVar4 = Mio_GateReadName(pMVar3->pRoot);
      printf("%6s",pcVar4);
      if ((pMVar3->field_0x4 & 0x1c) != 0) {
        uVar7 = 0;
        do {
          printf(" %6d",(ulong)(uint)pMVar3->pFanins[uVar7]->Num);
          uVar7 = uVar7 + 1;
        } while (uVar7 < (*(uint *)&pMVar3->field_0x4 >> 2 & 7));
      }
      printf("  %s",pMVar3->pFormula);
      putchar(10);
      Extra_PrintBinary(_stdout,pMVar3->uTruth,0x40);
      printf("  %3d",(ulong)(*(uint *)&pMVar3->field_0x4 >> 5 & 7));
      printf("  %6.2f",(double)pMVar3->Area);
      printf("  (%4.2f, %4.2f)",(double)(pMVar3->tDelayMax).Rise,(double)(pMVar3->tDelayMax).Fall);
      putchar(10);
      if (0 < pLib->nVarsMax) {
        pfVar9 = &pMVar3->tDelaysF[0].Fall;
        lVar8 = 0;
        do {
          fVar1 = pfVar9[-0x13];
          if ((0.0 <= fVar1) || (0.0 < pfVar9[-0x12] || pfVar9[-0x12] == 0.0)) {
            fVar2 = pfVar9[-0x12];
            if (0.0 <= fVar2) {
              if (0.0 <= fVar1) {
                printf(" (%4.2f, %4.2f)",(double)fVar1);
                goto LAB_00402b90;
              }
              pcVar4 = " (----, %4.2f)";
            }
            else {
              pcVar4 = " (%4.2f, ----)";
              fVar2 = fVar1;
            }
            printf(pcVar4,(double)fVar2);
          }
          else {
            printf(" (----, ----)");
          }
LAB_00402b90:
          fVar1 = ((Map_Time_t *)(pfVar9 + -1))->Rise;
          if ((0.0 <= fVar1) || (0.0 < *pfVar9 || *pfVar9 == 0.0)) {
            fVar2 = *pfVar9;
            if (0.0 <= fVar2) {
              if (0.0 <= fVar1) {
                printf(" (%4.2f, %4.2f)",(double)fVar1);
                goto LAB_00402bf5;
              }
              pcVar4 = " (----, %4.2f)";
            }
            else {
              pcVar4 = " (%4.2f, ----)";
              fVar2 = fVar1;
            }
            printf(pcVar4,(double)fVar2);
          }
          else {
            printf(" (----, ----)");
          }
LAB_00402bf5:
          putchar(10);
          lVar8 = lVar8 + 1;
          pfVar9 = pfVar9 + 3;
        } while (lVar8 < pLib->nVarsMax);
      }
      putchar(10);
      lVar5 = lVar5 + 1;
    } while ((int)lVar5 != 0x14);
  }
  return;
}

Assistant:

void Map_LibraryPrintTree( Map_SuperLib_t * pLib )
{
    Map_Super_t * pGate;
    int i, k;

    // print all the info related to the supergates
//    for ( i = pLib->nVarsMax; i < (int)pLib->nLines; i++ )
    for ( i = pLib->nVarsMax; i < 20; i++ )
    {
        pGate = pLib->ppSupers[i];

        // write the gate's fanin info and formula
        printf( "%6d  ", pGate->Num );
        printf( "%c ", pGate->fSuper? '*' : ' ' );
        printf( "%6s", Mio_GateReadName(pGate->pRoot) );
        for ( k = 0; k < (int)pGate->nFanins; k++ )
            printf( " %6d", pGate->pFanins[k]->Num );
        printf( "  %s", pGate->pFormula );
        printf( "\n" );

        // write the gate's derived info
        Extra_PrintBinary( stdout, pGate->uTruth, 64 );
        printf( "  %3d",   pGate->nGates );
        printf( "  %6.2f", pGate->Area );
        printf( "  (%4.2f, %4.2f)", pGate->tDelayMax.Rise, pGate->tDelayMax.Fall );
        printf( "\n" );
        for ( k = 0; k < pLib->nVarsMax; k++ )
        {
            // print the constraint on the rise of the gate in the form (D1, D2), 
            // where D1 is the constraint related to the rise of the k-th PI
            // where D2 is the constraint related to the fall of the k-th PI
            if ( pGate->tDelaysR[k].Rise < 0 && pGate->tDelaysR[k].Fall < 0 )
                printf( " (----, ----)" );
            else if ( pGate->tDelaysR[k].Fall < 0 )
                printf( " (%4.2f, ----)", pGate->tDelaysR[k].Rise );
            else if ( pGate->tDelaysR[k].Rise < 0 )
                printf( " (----, %4.2f)", pGate->tDelaysR[k].Fall );
            else
                printf( " (%4.2f, %4.2f)", pGate->tDelaysR[k].Rise, pGate->tDelaysR[k].Fall );

            // print the constraint on the fall of the gate in the form (D1, D2), 
            // where D1 is the constraint related to the rise of the k-th PI
            // where D2 is the constraint related to the fall of the k-th PI
            if ( pGate->tDelaysF[k].Rise < 0 && pGate->tDelaysF[k].Fall < 0 )
                printf( " (----, ----)" );
            else if ( pGate->tDelaysF[k].Fall < 0 )
                printf( " (%4.2f, ----)", pGate->tDelaysF[k].Rise );
            else if ( pGate->tDelaysF[k].Rise < 0 )
                printf( " (----, %4.2f)", pGate->tDelaysF[k].Fall );
            else
                printf( " (%4.2f, %4.2f)", pGate->tDelaysF[k].Rise, pGate->tDelaysF[k].Fall );
            printf( "\n" );
        }
        printf( "\n" );
    }
}